

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brktrans.cpp
# Opt level: O2

void __thiscall
icu_63::BreakTransliterator::handleTransliterate
          (BreakTransliterator *this,Replaceable *text,UTransPosition *offsets,UBool isIncremental)

{
  UnicodeString *pUVar1;
  short sVar2;
  BreakTransliterator *pBVar3;
  byte bVar4;
  int iVar5;
  UChar32 UVar6;
  uint uVar7;
  int iVar8;
  Locale *key;
  BreakIterator *pBVar9;
  UVector32 *this_00;
  undefined7 in_register_00000009;
  int32_t iVar10;
  int iVar11;
  UErrorCode status;
  BreakTransliterator *local_90;
  undefined4 local_84;
  Replaceable *local_80;
  Mutex m_1;
  UnicodeString sText;
  
  status = U_ZERO_ERROR;
  sText.super_Replaceable.super_UObject._vptr_UObject = (UObject)(_func_int **)0x0;
  local_80 = text;
  umtx_lock_63((UMutex *)0x0);
  pBVar9 = (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr;
  this_00 = (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr;
  (this->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr = (BreakIterator *)0x0;
  (this->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr = (UVector32 *)0x0;
  local_90 = this;
  Mutex::~Mutex((Mutex *)&sText);
  if (pBVar9 == (BreakIterator *)0x0) {
    key = Locale::getEnglish();
    text = (Replaceable *)&status;
    pBVar9 = BreakIterator::createWordInstance(key,(UErrorCode *)text);
  }
  if (this_00 == (UVector32 *)0x0) {
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)text);
    if (this_00 == (UVector32 *)0x0) {
      this_00 = (UVector32 *)0x0;
    }
    else {
      UVector32::UVector32(this_00,&status);
    }
  }
  if (((pBVar9 != (BreakIterator *)0x0) && (this_00 != (UVector32 *)0x0)) &&
     (status < U_ILLEGAL_ARGUMENT_ERROR)) {
    UVector32::removeAllElements(this_00);
    replaceableAsString(&sText,local_80);
    (*(pBVar9->super_UObject)._vptr_UObject[7])(pBVar9,&sText);
    (*(pBVar9->super_UObject)._vptr_UObject[0x10])(pBVar9,(ulong)(uint)offsets->start);
    local_84 = (undefined4)CONCAT71(in_register_00000009,isIncremental);
    iVar5 = (*(pBVar9->super_UObject)._vptr_UObject[0xd])();
    while ((iVar8 = offsets->limit, iVar5 != -1 && (iVar5 < iVar8))) {
      if (iVar5 != 0) {
        UVar6 = icu_63::UnicodeString::char32At(&sText,iVar5 + -1);
        bVar4 = u_charType_63(UVar6);
        if ((0x1feU >> (bVar4 & 0x1f) & 1) != 0) {
          UVar6 = icu_63::UnicodeString::char32At(&sText,iVar5);
          bVar4 = u_charType_63(UVar6);
          if ((0x1feU >> (bVar4 & 0x1f) & 1) != 0) {
            UVector32::addElement(this_00,iVar5,&status);
          }
        }
      }
      iVar5 = (*(pBVar9->super_UObject)._vptr_UObject[0xd])();
    }
    uVar7 = this_00->count;
    if ((ulong)uVar7 == 0) {
      iVar11 = 0;
      iVar5 = 0;
    }
    else {
      sVar2 = (local_90->fInsertion).fUnion.fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar10 = (local_90->fInsertion).fUnion.fFields.fLength;
      }
      else {
        iVar10 = (int)sVar2 >> 5;
      }
      if ((int)uVar7 < 1) {
        iVar5 = 0;
      }
      else {
        iVar5 = this_00->elements[(ulong)uVar7 - 1];
      }
      pUVar1 = &local_90->fInsertion;
      iVar11 = iVar10 * uVar7;
      while (0 < this_00->count) {
        uVar7 = this_00->count - 1;
        this_00->count = uVar7;
        (*(local_80->super_UObject)._vptr_UObject[4])
                  (local_80,(ulong)(uint)this_00->elements[uVar7],
                   (ulong)(uint)this_00->elements[uVar7],pUVar1);
      }
      iVar8 = offsets->limit;
    }
    pBVar3 = local_90;
    offsets->contextLimit = offsets->contextLimit + iVar11;
    offsets->limit = iVar8 + iVar11;
    iVar5 = iVar5 + iVar11;
    if ((char)local_84 == '\0') {
      iVar5 = iVar8 + iVar11;
    }
    offsets->start = iVar5;
    m_1.fMutex = (UMutex *)0x0;
    umtx_lock_63((UMutex *)0x0);
    if ((pBVar3->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr == (BreakIterator *)0x0
       ) {
      (pBVar3->cachedBI).super_LocalPointerBase<icu_63::BreakIterator>.ptr = pBVar9;
      pBVar9 = (BreakIterator *)0x0;
    }
    if ((pBVar3->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr == (UVector32 *)0x0
       ) {
      (pBVar3->cachedBoundaries).super_LocalPointerBase<icu_63::UVector32>.ptr = this_00;
      this_00 = (UVector32 *)0x0;
    }
    Mutex::~Mutex(&m_1);
    icu_63::UnicodeString::~UnicodeString(&sText);
  }
  if (this_00 != (UVector32 *)0x0) {
    (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
  }
  if (pBVar9 != (BreakIterator *)0x0) {
    (*(pBVar9->super_UObject)._vptr_UObject[1])(pBVar9);
  }
  return;
}

Assistant:

void BreakTransliterator::handleTransliterate(Replaceable& text, UTransPosition& offsets,
                                                    UBool isIncremental ) const {

        UErrorCode status = U_ZERO_ERROR;
        LocalPointer<BreakIterator> bi;
        LocalPointer<UVector32> boundaries;

        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            boundaries.moveFrom(nonConstThis->cachedBoundaries);
            bi.moveFrom(nonConstThis->cachedBI);
        }
        if (bi.isNull()) {
            bi.adoptInstead(BreakIterator::createWordInstance(Locale::getEnglish(), status));
        }
        if (boundaries.isNull()) {
            boundaries.adoptInstead(new UVector32(status));
        }

        if (bi.isNull() || boundaries.isNull() || U_FAILURE(status)) {
            return;
        }

        boundaries->removeAllElements();
        UnicodeString sText = replaceableAsString(text);
        bi->setText(sText);
        bi->preceding(offsets.start);

        // To make things much easier, we will stack the boundaries, and then insert at the end.
        // generally, we won't need too many, since we will be filtered.

        int32_t boundary;
        for(boundary = bi->next(); boundary != UBRK_DONE && boundary < offsets.limit; boundary = bi->next()) {
            if (boundary == 0) continue;
            // HACK: Check to see that preceeding item was a letter

            UChar32 cp = sText.char32At(boundary-1);
            int type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (before): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            cp = sText.char32At(boundary);
            type = u_charType(cp);
            //System.out.println(Integer.toString(cp,16) + " (after): " + type);
            if ((U_MASK(type) & (U_GC_L_MASK | U_GC_M_MASK)) == 0) continue;

            boundaries->addElement(boundary, status);
            // printf("Boundary at %d\n", boundary);
        }

        int delta = 0;
        int lastBoundary = 0;

        if (boundaries->size() != 0) { // if we found something, adjust
            delta = boundaries->size() * fInsertion.length();
            lastBoundary = boundaries->lastElementi();

            // we do this from the end backwards, so that we don't have to keep updating.

            while (boundaries->size() > 0) {
                boundary = boundaries->popi();
                text.handleReplaceBetween(boundary, boundary, fInsertion);
            }
        }

        // Now fix up the return values
        offsets.contextLimit += delta;
        offsets.limit += delta;
        offsets.start = isIncremental ? lastBoundary + delta : offsets.limit;

        // Return break iterator & boundaries vector to the cache.
        {
            Mutex m;
            BreakTransliterator *nonConstThis = const_cast<BreakTransliterator *>(this);
            if (nonConstThis->cachedBI.isNull()) {
                nonConstThis->cachedBI.moveFrom(bi);
            }
            if (nonConstThis->cachedBoundaries.isNull()) {
                nonConstThis->cachedBoundaries.moveFrom(boundaries);
            }
        }

        // TODO:  do something with U_FAILURE(status);
        //        (need to look at transliterators overall, not just here.)
}